

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<false,true,false>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4 = ZEXT816(0) << 0x40;
  uVar2 = 0;
  while( true ) {
    if ((~((int)*(uint *)(this + 0x14) >> 0x1f) & *(uint *)(this + 0x14)) == uVar2) break;
    auVar5._0_8_ = (double)(*(float *)(*(long *)(this + 0xf8) + uVar2 * 4) /
                           *(float *)(*(long *)(this + 0xf0) + uVar2 * 4));
    auVar5._8_8_ = 0;
    auVar3._0_8_ = (double)auVar4._0_4_;
    auVar3._8_8_ = auVar4._8_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x78) + uVar2 * 8);
    auVar1 = vfmadd231sd_fma(auVar3,auVar5,auVar1);
    uVar2 = uVar2 + 1;
    auVar4._0_4_ = (float)auVar1._0_8_;
    auVar4._4_12_ = auVar1._4_12_;
  }
  *outSumDerivatives = (double)auVar4._0_4_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}